

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_attr * lyd_dup_attr(ly_ctx *ctx,lyd_node *parent,lyd_attr *attr)

{
  lyd_attr *plVar1;
  char *pcVar2;
  __pthread_internal_list *p_Var3;
  undefined8 *puVar4;
  ly_ctx *local_30;
  lyd_attr *ret;
  lyd_attr *attr_local;
  lyd_node *parent_local;
  ly_ctx *ctx_local;
  
  if (parent->attr == (lyd_attr *)0x0) {
    plVar1 = (lyd_attr *)malloc(0x38);
    parent->attr = plVar1;
    local_30 = (ly_ctx *)parent->attr;
  }
  else {
    for (local_30 = (ly_ctx *)parent->attr; *(lyd_attr **)((long)local_30 + 8) != (lyd_attr *)0x0;
        local_30 = *(ly_ctx **)((long)local_30 + 8)) {
    }
    plVar1 = (lyd_attr *)calloc(1,0x38);
    *(lyd_attr **)((long)local_30 + 8) = plVar1;
    local_30 = *(ly_ctx **)((long)local_30 + 8);
  }
  if (local_30 == (ly_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_attr");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    (local_30->dict).hash_tab = (hash_table *)parent;
    (local_30->dict).lock.__align = 0;
    *(lys_ext_instance_complex **)((long)&(local_30->dict).lock + 8) = attr->annotation;
    pcVar2 = lydict_insert(ctx,attr->name,0);
    *(char **)((long)&(local_30->dict).lock + 0x10) = pcVar2;
    p_Var3 = (__pthread_internal_list *)lydict_insert(ctx,attr->value_str,0);
    (local_30->dict).lock.__data.__list.__prev = p_Var3;
    *(LY_DATA_TYPE *)&(local_30->models).search_paths = attr->value_type;
    *(uint8_t *)((long)&(local_30->models).search_paths + 4) = attr->value_flags;
    switch(*(LY_DATA_TYPE *)&(local_30->models).search_paths) {
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
      *(__pthread_internal_list **)&(local_30->dict).lock.__data.__list.__next =
           (local_30->dict).lock.__data.__list.__prev;
      break;
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
    case LY_TYPE_IDENT:
      puVar4 = (undefined8 *)
               lys_ext_complex_get_substmt
                         (LY_STMT_TYPE,
                          *(lys_ext_instance_complex **)((long)&(local_30->dict).lock + 8),
                          (lyext_substmt **)0x0);
      lyp_parse_value((lys_type *)*puVar4,(char **)((long)&(local_30->dict).lock + 0x18),
                      (lyxml_elem *)0x0,(lyd_node_leaf_list *)0x0,(lyd_attr *)local_30,
                      (lys_module *)0x0,1,0,0);
      break;
    default:
      *(lyd_val *)&(local_30->dict).lock.__data.__list.__next = attr->value;
      break;
    case LY_TYPE_INST:
      ((lyd_val *)&(local_30->dict).lock.__data.__list.__next)->binary = (char *)0x0;
      break;
    case LY_TYPE_LEAFREF:
      puVar4 = (undefined8 *)
               lys_ext_complex_get_substmt
                         (LY_STMT_TYPE,
                          *(lys_ext_instance_complex **)((long)&(local_30->dict).lock + 8),
                          (lyext_substmt **)0x0);
      lyp_parse_value((lys_type *)*puVar4,(char **)((long)&(local_30->dict).lock + 0x18),
                      (lyxml_elem *)0x0,(lyd_node_leaf_list *)0x0,(lyd_attr *)local_30,
                      (lys_module *)0x0,1,0,0);
      break;
    case LY_TYPE_UNION:
      pcVar2 = lydict_insert(ctx,(attr->value).binary,0);
      ((lyd_val *)&(local_30->dict).lock.__data.__list.__next)->binary = pcVar2;
    }
    ctx_local = local_30;
  }
  return (lyd_attr *)ctx_local;
}

Assistant:

static struct lyd_attr *
lyd_dup_attr(struct ly_ctx *ctx, struct lyd_node *parent, struct lyd_attr *attr)
{
    struct lyd_attr *ret;

    /* allocate new attr */
    if (!parent->attr) {
        parent->attr = malloc(sizeof *parent->attr);
        ret = parent->attr;
    } else {
        for (ret = parent->attr; ret->next; ret = ret->next);
        ret->next = calloc(1, sizeof *ret);
        ret = ret->next;
    }
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(ctx), NULL);

    /* fill new attr except */
    ret->parent = parent;
    ret->next = NULL;
    ret->annotation = attr->annotation;
    ret->name = lydict_insert(ctx, attr->name, 0);
    ret->value_str = lydict_insert(ctx, attr->value_str, 0);
    ret->value_type = attr->value_type;
    ret->value_flags = attr->value_flags;
    switch (ret->value_type) {
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
        /* value_str pointer is shared in these cases */
        ret->value.string = ret->value_str;
        break;
    case LY_TYPE_LEAFREF:
        lyp_parse_value(*((struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, ret->annotation, NULL)),
                             &ret->value_str, NULL, NULL, ret, NULL, 1, 0, 0);
        break;
    case LY_TYPE_INST:
        ret->value.instance = NULL;
        break;
    case LY_TYPE_UNION:
        /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
         * because of possible change of the value in case of instance-identifier) */
        ret->value.string = lydict_insert(ctx, attr->value.string, 0);
        break;
    case LY_TYPE_ENUM:
    case LY_TYPE_IDENT:
    case LY_TYPE_BITS:
        /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
         * a different context, searching for the type and duplicating the data is almost as same as resolving
         * the string value, so due to a simplicity, parse the value for the duplicated leaf */
        lyp_parse_value(*((struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, ret->annotation, NULL)),
                             &ret->value_str, NULL, NULL, ret, NULL, 1, 0, 0);
        break;
    default:
        ret->value = attr->value;
        break;
    }
    return ret;
}